

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::audit_interaction(audit_results *dat,audit_strings *f)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  string ns_pre;
  value_type local_38;
  
  if (f == (audit_strings *)0x0) {
    pbVar2 = (dat->ns_pre).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((dat->ns_pre).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar2) {
      (dat->ns_pre).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
      pcVar3 = pbVar2[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar2[-1].field_2) {
        operator_delete(pcVar3);
        return;
      }
    }
  }
  else {
    paVar1 = &local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if ((dat->ns_pre).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (dat->ns_pre).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::push_back((char)&local_38);
    }
    iVar4 = std::__cxx11::string::compare((char *)f);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)f);
      if (iVar4 != 0) {
        std::__cxx11::string::_M_append((char *)&local_38,(ulong)(f->first)._M_dataplus._M_p);
        std::__cxx11::string::push_back((char)&local_38);
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)&f->second);
    if (iVar4 != 0) {
      std::__cxx11::string::_M_append((char *)&local_38,(ulong)(f->second)._M_dataplus._M_p);
    }
    if (local_38._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&dat->ns_pre,&local_38);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void audit_interaction(audit_results& dat, const audit_strings* f)
{
  if (f == nullptr)
  {
    if (!dat.ns_pre.empty())
    {
      dat.ns_pre.pop_back();
    }

    return;
  }

  string ns_pre;
  if (!dat.ns_pre.empty())
    ns_pre += '*';

  if (f->first != "" && ((f->first) != " "))
  {
    ns_pre.append(f->first);
    ns_pre += '^';
  }

  if (f->second != "")
  {
    ns_pre.append(f->second);
  }

  if (!ns_pre.empty())
  {
    dat.ns_pre.push_back(ns_pre);
  }
}